

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O3

int __thiscall
alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::
best_split_propagation
          (Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
           *this,vector<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode>_>
                 *traversal_path,bool verbose)

{
  double dVar1;
  pointer pTVar2;
  bool bVar3;
  ostream *poVar4;
  uint uVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  TraversalNode *tn;
  pointer pTVar10;
  TraversalNode *tn_1;
  double dVar11;
  vector<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::SplitDecisionCosts,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::SplitDecisionCosts>_>
  traversal_costs;
  double local_60;
  void *local_58;
  iterator iStack_50;
  SplitDecisionCosts *local_48;
  SplitDecisionCosts local_40;
  
  if (this->root_node_->is_leaf_ == true) {
    iVar7 = (int)(this->superroot_->super_AlexNode<double,_double>).level_;
  }
  else {
    local_48 = (SplitDecisionCosts *)0x0;
    local_58 = (void *)0x0;
    iStack_50._M_current = (SplitDecisionCosts *)0x0;
    pTVar10 = (traversal_path->
              super__Vector_base<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pTVar2 = (traversal_path->
             super__Vector_base<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (pTVar10 != pTVar2) {
      do {
        local_40.stop_cost = 0.0;
        uVar5 = pTVar10->node->num_children_;
        if ((pTVar10->node->children_[pTVar10->bucketID]->duplication_factor_ == '\0') &&
           (local_40.stop_cost = 1.79769313486232e+308,
           (int)uVar5 < (this->derived_params_).max_fanout)) {
          local_40.stop_cost = (double)(int)uVar5 + 8.0;
        }
        local_40.split_cost =
             (double)((ulong)(2 < (int)uVar5) * (long)(double)(int)((uVar5 >> 1) + 8));
        if (iStack_50._M_current == local_48) {
          std::
          vector<alex::Alex<double,double,alex::AlexCompare,std::allocator<std::pair<double,double>>,true>::SplitDecisionCosts,std::allocator<alex::Alex<double,double,alex::AlexCompare,std::allocator<std::pair<double,double>>,true>::SplitDecisionCosts>>
          ::
          _M_realloc_insert<alex::Alex<double,double,alex::AlexCompare,std::allocator<std::pair<double,double>>,true>::SplitDecisionCosts>
                    ((vector<alex::Alex<double,double,alex::AlexCompare,std::allocator<std::pair<double,double>>,true>::SplitDecisionCosts,std::allocator<alex::Alex<double,double,alex::AlexCompare,std::allocator<std::pair<double,double>>,true>::SplitDecisionCosts>>
                      *)&local_58,iStack_50,&local_40);
        }
        else {
          (iStack_50._M_current)->stop_cost = local_40.stop_cost;
          (iStack_50._M_current)->split_cost = local_40.split_cost;
          iStack_50._M_current = iStack_50._M_current + 1;
        }
        pTVar10 = pTVar10 + 1;
      } while (pTVar10 != pTVar2);
    }
    uVar5 = (int)((ulong)((long)iStack_50._M_current - (long)local_58) >> 4) - 1;
    iVar7 = (int)(this->superroot_->super_AlexNode<double,_double>).level_;
    if ((int)uVar5 < 0) {
      local_60 = 1.79769313486232e+308;
    }
    else {
      lVar6 = (ulong)uVar5 << 4;
      dVar11 = 0.0;
      local_60 = 1.79769313486232e+308;
      lVar8 = (ulong)uVar5 + 1;
      do {
        dVar1 = *(double *)((long)local_58 + lVar6);
        if (((dVar1 != 1.79769313486232e+308) || (NAN(dVar1))) && (dVar11 + dVar1 < local_60)) {
          iVar7 = (int)*(short *)(*(long *)((long)&((traversal_path->
                                                                                                        
                                                  super__Vector_base<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->node
                                           + lVar6) + 10);
          local_60 = dVar11 + dVar1;
        }
        dVar11 = dVar11 + *(double *)((long)local_58 + lVar6 + 8);
        lVar6 = lVar6 + -0x10;
        lVar9 = lVar8 + -1;
        bVar3 = 0 < lVar8;
        lVar8 = lVar9;
      } while (lVar9 != 0 && bVar3);
    }
    if (verbose) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"[Best split propagation] best level: ",0x25);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,", parent level: ",0x10);
      poVar4 = (ostream *)
               std::ostream::operator<<
                         (poVar4,(((traversal_path->
                                   super__Vector_base<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode>_>
                                   )._M_impl.super__Vector_impl_data._M_finish[-1].node)->
                                 super_AlexNode<double,_double>).level_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,", best cost: ",0xd);
      poVar4 = std::ostream::_M_insert<double>(local_60);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,", traversal path (level/addr/n_children): ",0x2a);
      pTVar2 = (traversal_path->
               super__Vector_base<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (pTVar10 = (traversal_path->
                     super__Vector_base<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode>_>
                     )._M_impl.super__Vector_impl_data._M_start; pTVar10 != pTVar2;
          pTVar10 = pTVar10 + 1) {
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           ((ostream *)&std::cout,
                            (pTVar10->node->super_AlexNode<double,_double>).level_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"/",1);
        poVar4 = std::ostream::_M_insert<void_const*>(poVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"/",1);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,pTVar10->node->num_children_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
      std::ostream::put(-0x80);
      std::ostream::flush();
    }
    if (local_58 != (void *)0x0) {
      operator_delete(local_58,(long)local_48 - (long)local_58);
    }
  }
  return iVar7;
}

Assistant:

int best_split_propagation(const std::vector<TraversalNode>& traversal_path,
                             bool verbose = false) const {
    if (root_node_->is_leaf_) {
      return superroot_->level_;
    }

    // Find costs on the path down to data node
    std::vector<SplitDecisionCosts> traversal_costs;
    for (const TraversalNode& tn : traversal_path) {
      double stop_cost;
      AlexNode<T, P>* next = tn.node->children_[tn.bucketID];
      if (next->duplication_factor_ > 0) {
        stop_cost = 0;
      } else {
        stop_cost =
            tn.node->num_children_ >= derived_params_.max_fanout
                ? std::numeric_limits<double>::max()
                : tn.node->num_children_ + SplitDecisionCosts::base_cost;
      }
      traversal_costs.push_back(
          {stop_cost,
           tn.node->num_children_ <= 2
               ? 0
               : tn.node->num_children_ / 2 + SplitDecisionCosts::base_cost});
    }

    // Compute back upwards to find the optimal node to stop propagation.
    // Ignore the superroot (the first node in the traversal path).
    double cumulative_cost = 0;
    double best_cost = std::numeric_limits<double>::max();
    int best_path_level = superroot_->level_;
    for (int i = traversal_costs.size() - 1; i >= 0; i--) {
      SplitDecisionCosts& c = traversal_costs[i];
      if (c.stop_cost != std::numeric_limits<double>::max() &&
          cumulative_cost + c.stop_cost < best_cost) {
        best_cost = cumulative_cost + c.stop_cost;
        best_path_level = traversal_path[i].node->level_;
      }
      cumulative_cost += c.split_cost;
    }

    if (verbose) {
      std::cout << "[Best split propagation] best level: " << best_path_level
                << ", parent level: " << traversal_path.back().node->level_
                << ", best cost: " << best_cost
                << ", traversal path (level/addr/n_children): ";
      for (const TraversalNode& tn : traversal_path) {
        std::cout << tn.node->level_ << "/" << tn.node << "/"
                  << tn.node->num_children_ << " ";
      }
      std::cout << std::endl;
    }
    return best_path_level;
  }